

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBblif.c
# Opt level: O1

void Io_WriteBblif(Abc_Ntk_t *pNtk,char *pFileName)

{
  Bbl_Man_t *p;
  
  p = Bbl_ManFromAbc(pNtk);
  Bbl_ManDumpBinaryBlif(p,pFileName);
  Bbl_ManStop(p);
  return;
}

Assistant:

void Io_WriteBblif( Abc_Ntk_t * pNtk, char * pFileName )
{
    Bbl_Man_t * p;
    p = Bbl_ManFromAbc( pNtk );
//Bbl_ManPrintStats( p );
//Bbl_ManDumpBlif( p, "test_bbl.blif" );
    Bbl_ManDumpBinaryBlif( p, pFileName );
    Bbl_ManStop( p );
}